

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntConstMath.cpp
# Opt level: O0

bool IntConstMath::Mul(IntConstType left,IntConstType right,IRType type,IntConstType *result)

{
  bool bVar1;
  undefined1 local_2a;
  bool overflowed;
  IntConstType *result_local;
  IRType type_local;
  IntConstType right_local;
  IntConstType left_local;
  
  bVar1 = Int64Math::Mul(left,right,result);
  local_2a = 1;
  if (!bVar1) {
    bVar1 = IsValid(*result,type);
    local_2a = bVar1 ^ 0xff;
  }
  return (bool)(local_2a & 1);
}

Assistant:

bool IntConstMath::Mul(IntConstType left, IntConstType right, IRType type, IntConstType * result)
{
#if TARGET_32
    bool overflowed = Int32Math::Mul(left, right, result);
    CompileAssert(sizeof(IntConstType) == sizeof(int32));
#elif TARGET_64
    bool overflowed = Int64Math::Mul(left, right, result);
    CompileAssert(sizeof(IntConstType) == sizeof(int64));
#endif
    return overflowed || !IsValid(*result, type);
}